

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

void __thiscall
HVectorBase<double>::saxpy<HighsCDouble,HighsCDouble>
          (HVectorBase<double> *this,HighsCDouble pivotX,HVectorBase<HighsCDouble> *pivot)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pHVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  int local_7c;
  HighsCDouble local_58;
  double local_48;
  undefined8 uStack_40;
  
  local_58.lo = pivotX.lo;
  local_58.hi = pivotX.hi;
  local_7c = this->count;
  iVar1 = pivot->count;
  if (0 < (long)iVar1) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar6 = (pivot->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar2 = piVar5[lVar8];
      local_48 = pdVar4[iVar2];
      uStack_40 = 0;
      HVar13 = HighsCDouble::operator*(&local_58,pHVar6[iVar2].hi);
      dVar11 = local_58.hi * pHVar6[iVar2].lo;
      if ((local_48 == 0.0) && (!NAN(local_48))) {
        lVar7 = (long)local_7c;
        local_7c = local_7c + 1;
        piVar3[lVar7] = iVar2;
      }
      dVar12 = HVar13.hi + dVar11;
      dVar10 = local_48 + dVar12;
      dVar10 = (local_48 - (dVar10 - dVar12)) + (dVar12 - (dVar10 - (dVar10 - dVar12))) +
               HVar13.lo + (HVar13.hi - (dVar12 - dVar11)) + (dVar11 - (dVar12 - (dVar12 - dVar11)))
               + dVar10;
      uVar9 = -(ulong)(ABS(dVar10) < 1e-14);
      pdVar4[iVar2] = (double)(~uVar9 & (ulong)dVar10 | uVar9 & 0x358dee7a4ad4b81f);
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  this->count = local_7c;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}